

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodecTests.cc
# Opt level: O3

void avro::parsing::testWriterFail<avro::parsing::ValidatingCodecFactory>(TestData2 *td)

{
  char *pcVar1;
  undefined1 *puVar2;
  size_t sVar3;
  auto_ptr<avro::OutputStream> p;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v;
  ValidSchema vs;
  auto_ptr<avro::OutputStream> local_230;
  undefined1 local_228 [32];
  assertion_result local_208;
  ValidSchema local_1f0;
  undefined1 local_1e0 [8];
  shared_count local_1d8;
  undefined8 *local_1d0;
  char *local_1c8;
  ios_base local_170 [264];
  undefined1 *local_68;
  undefined8 local_60;
  undefined1 local_58;
  undefined7 uStack_57;
  const_string local_38;
  
  testWriterFail<avro::parsing::ValidatingCodecFactory>::testNo =
       testWriterFail<avro::parsing::ValidatingCodecFactory>::testNo + 1;
  memset((ostringstream *)local_1e0,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
  local_60 = 0;
  local_58 = 0;
  local_68 = &local_58;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e0,"Test: ",6);
  std::ostream::operator<<(local_1e0,testWriterFail<avro::parsing::ValidatingCodecFactory>::testNo);
  local_228[0] = 0x20;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e0,local_228,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e0," schema: ",9);
  pcVar1 = td->schema;
  if (pcVar1 == (char *)0x0) {
    std::ios::clear((int)&stack0xfffffffffffffdc8 + (int)*(_func_int **)((long)local_1e0 + -0x18) +
                    0x58);
  }
  else {
    sVar3 = strlen(pcVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e0,pcVar1,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e0," incorrectCalls: ",0x11);
  pcVar1 = td->incorrectCalls;
  if (pcVar1 == (char *)0x0) {
    std::ios::clear((int)&stack0xfffffffffffffdc8 + (int)*(_func_int **)((long)local_1e0 + -0x18) +
                    0x58);
  }
  else {
    sVar3 = strlen(pcVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e0,pcVar1,sVar3);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_68,(string *)local_228);
  if ((pointer)local_228._0_8_ != (pointer)(local_228 + 0x10)) {
    operator_delete((void *)local_228._0_8_,
                    (ulong)((long)&((_Alloc_hider *)local_228._16_8_)->_M_p + 1));
  }
  puVar2 = local_68;
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1db2b0,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,(ulong)puVar2);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x2e9;
  if (local_68 != &local_58) {
    operator_delete(local_68,CONCAT71(uStack_57,local_58) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e0);
  std::ios_base::~ios_base(local_170);
  makeValidSchema((parsing *)&local_1f0,td->schema);
  local_228._16_8_ = (pointer)0x0;
  local_228._0_8_ = (pointer)0x0;
  local_228._8_8_ = (pointer)0x0;
  local_230._M_ptr = (OutputStream *)0x0;
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1db2b0,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1af701);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x2ef;
  ValidatingEncoderFactory::newEncoder((ValidatingEncoderFactory *)local_1e0,&local_1f0);
  testEncoder((EncoderPtr *)local_1e0,td->incorrectCalls,
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_228,&local_230);
  boost::detail::shared_count::~shared_count(&local_1d8);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1db2b0,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1af701);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x2ef;
  local_208.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x0;
  local_208.m_message.px = (element_type *)0x0;
  local_208.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1d8.pi_._0_1_ = false;
  local_1e0 = (undefined1  [8])&PTR__lazy_ostream_001d7a70;
  local_1d0 = &boost::unit_test::lazy_ostream::inst;
  local_1c8 = "exception Exception expected but not raised";
  local_38.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
  ;
  local_38.m_end = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_208,(lazy_ostream *)local_1e0,&local_38,0x2ef,CHECK,CHECK_MSG,0);
  boost::detail::shared_count::~shared_count(&local_208.m_message.pn);
  if (local_230._M_ptr != (OutputStream *)0x0) {
    (**(code **)(*(long *)local_230._M_ptr + 8))();
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_228);
  boost::detail::shared_count::~shared_count(&local_1f0.root_.pn);
  return;
}

Assistant:

void testWriterFail(const TestData2& td) {
    static int testNo = 0;
    testNo++;
    BOOST_TEST_CHECKPOINT("Test: " << testNo << ' '
        << " schema: " << td.schema
        << " incorrectCalls: " << td.incorrectCalls);
    ValidSchema vs = makeValidSchema(td.schema);

    vector<string> v;
    auto_ptr<OutputStream> p;
    BOOST_CHECK_THROW(testEncoder(CodecFactory::newEncoder(vs),
        td.incorrectCalls, v, p), Exception);
}